

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

void iCopyColors<cRGB555,cBGRA,bReverseSubtract>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  EBlend EVar4;
  FSpecialColormap *pFVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  BYTE BVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  
  pFVar5 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_00647679_caseD_0:
    if (0 < count) {
      lVar6 = 0;
      do {
        iVar14 = (*(ushort *)pin & 0x1f) * 8 * inf->alpha + (uint)pout[lVar6 * 4 + 2] * -0x10000;
        if (iVar14 >> 0x10 < 1) {
          iVar14 = 0;
        }
        pout[lVar6 * 4 + 2] = (BYTE)((uint)iVar14 >> 0x10);
        iVar14 = (*(ushort *)pin >> 2 & 0xf8) * inf->alpha + (uint)pout[lVar6 * 4 + 1] * -0x10000;
        if (iVar14 >> 0x10 < 1) {
          iVar14 = 0;
        }
        pout[lVar6 * 4 + 1] = (BYTE)((uint)iVar14 >> 0x10);
        iVar14 = (*(ushort *)pin >> 7 & 0xf8) * inf->alpha + (uint)pout[lVar6 * 4] * -0x10000;
        if (iVar14 >> 0x10 < 1) {
          iVar14 = 0;
        }
        pout[lVar6 * 4] = (BYTE)((uint)iVar14 >> 0x10);
        pout[lVar6 * 4 + 3] = 0xff;
        pin = (BYTE *)((long)pin + (long)step);
        lVar6 = lVar6 + 1;
      } while (count != (int)lVar6);
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_00647679_caseD_0;
    case BLEND_ICEMAP:
      if (0 < count) {
        lVar6 = 0;
        do {
          uVar3 = *(ushort *)pin;
          uVar9 = (uVar3 >> 2 & 0xf8) * 0x8f + ((uint)uVar3 * 8 & 0xff) * 0x4d +
                  (uVar3 >> 7 & 0xf8) * 0x24 >> 0xc;
          iVar14 = (uint)IcePalette[uVar9][0] * inf->alpha + (uint)pout[lVar6 * 4 + 2] * -0x10000;
          BVar13 = (BYTE)((uint)iVar14 >> 0x10);
          if (iVar14 >> 0x10 < 1) {
            BVar13 = '\0';
          }
          pout[lVar6 * 4 + 2] = BVar13;
          iVar14 = (uint)IcePalette[uVar9][1] * inf->alpha + (uint)pout[lVar6 * 4 + 1] * -0x10000;
          BVar13 = (BYTE)((uint)iVar14 >> 0x10);
          if (iVar14 >> 0x10 < 1) {
            BVar13 = '\0';
          }
          pout[lVar6 * 4 + 1] = BVar13;
          iVar14 = (uint)IcePalette[uVar9][2] * inf->alpha + (uint)pout[lVar6 * 4] * -0x10000;
          BVar13 = (BYTE)((uint)iVar14 >> 0x10);
          if (iVar14 >> 0x10 < 1) {
            BVar13 = '\0';
          }
          pout[lVar6 * 4] = BVar13;
          pout[lVar6 * 4 + 3] = 0xff;
          pin = (BYTE *)((long)pin + (long)step);
          lVar6 = lVar6 + 1;
        } while (count != (int)lVar6);
      }
      break;
    case BLEND_OVERLAY:
      if (0 < count) {
        lVar6 = 0;
        do {
          uVar3 = *(ushort *)pin;
          iVar14 = inf->blendcolor[3];
          iVar7 = inf->blendcolor[1];
          iVar10 = inf->blendcolor[2];
          iVar12 = (((uint)uVar3 * 8 & 0xff) * iVar14 + inf->blendcolor[0] >> 0x10 & 0xff) *
                   inf->alpha + (uint)pout[lVar6 * 4 + 2] * -0x10000;
          BVar13 = (BYTE)((uint)iVar12 >> 0x10);
          if (iVar12 >> 0x10 < 1) {
            BVar13 = '\0';
          }
          pout[lVar6 * 4 + 2] = BVar13;
          iVar7 = ((uVar3 >> 2 & 0xf8) * iVar14 + iVar7 >> 0x10 & 0xff) * inf->alpha +
                  (uint)pout[lVar6 * 4 + 1] * -0x10000;
          BVar13 = (BYTE)((uint)iVar7 >> 0x10);
          if (iVar7 >> 0x10 < 1) {
            BVar13 = '\0';
          }
          pout[lVar6 * 4 + 1] = BVar13;
          iVar14 = ((uVar3 >> 7 & 0xf8) * iVar14 + iVar10 >> 0x10 & 0xff) * inf->alpha +
                   (uint)pout[lVar6 * 4] * -0x10000;
          BVar13 = (BYTE)((uint)iVar14 >> 0x10);
          if (iVar14 >> 0x10 < 1) {
            BVar13 = '\0';
          }
          pout[lVar6 * 4] = BVar13;
          pout[lVar6 * 4 + 3] = 0xff;
          pin = (BYTE *)((long)pin + (long)step);
          lVar6 = lVar6 + 1;
        } while (count != (int)lVar6);
      }
      break;
    case BLEND_MODULATE:
      if (0 < count) {
        lVar6 = 0;
        do {
          uVar3 = *(ushort *)pin;
          iVar14 = (((uint)uVar3 * 8 & 0xff) * inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha +
                   (uint)pout[lVar6 * 4 + 2] * -0x10000;
          if (iVar14 >> 0x10 < 1) {
            iVar14 = 0;
          }
          iVar7 = inf->blendcolor[1];
          iVar10 = inf->blendcolor[2];
          pout[lVar6 * 4 + 2] = (BYTE)((uint)iVar14 >> 0x10);
          iVar14 = ((uVar3 >> 2 & 0xf8) * iVar7 >> 0x10 & 0xff) * inf->alpha +
                   (uint)pout[lVar6 * 4 + 1] * -0x10000;
          if (iVar14 >> 0x10 < 1) {
            iVar14 = 0;
          }
          pout[lVar6 * 4 + 1] = (BYTE)((uint)iVar14 >> 0x10);
          iVar14 = ((uVar3 >> 7 & 0xf8) * iVar10 >> 0x10 & 0xff) * inf->alpha +
                   (uint)pout[lVar6 * 4] * -0x10000;
          if (iVar14 >> 0x10 < 1) {
            iVar14 = 0;
          }
          pout[lVar6 * 4] = (BYTE)((uint)iVar14 >> 0x10);
          pout[lVar6 * 4 + 3] = 0xff;
          pin = (BYTE *)((long)pin + (long)step);
          lVar6 = lVar6 + 1;
        } while (count != (int)lVar6);
      }
      break;
    default:
      EVar4 = inf->blend;
      lVar6 = (long)EVar4;
      if (lVar6 < 0x21) {
        if ((BLEND_ICEMAP < EVar4) && (0 < count)) {
          iVar14 = 0x20 - EVar4;
          lVar6 = 0;
          do {
            uVar3 = *(ushort *)pin;
            uVar9 = (uint)uVar3 * 8 & 0xff;
            uVar11 = uVar3 >> 2 & 0xf8;
            uVar16 = uVar3 >> 7 & 0xf8;
            iVar7 = (uVar11 * 0x8f + uVar9 * 0x4d + uVar16 * 0x24 >> 8) * (EVar4 + BLEND_MODULATE);
            iVar10 = uVar9 * iVar14 + iVar7;
            iVar12 = uVar11 * iVar14 + iVar7;
            iVar7 = uVar16 * iVar14 + iVar7;
            iVar10 = ((uint)((ulong)((long)iVar10 * 0x84210843) >> 0x24) - (iVar10 >> 0x1f) & 0xff)
                     * inf->alpha + (uint)pout[lVar6 * 4 + 2] * -0x10000;
            BVar13 = (BYTE)((uint)iVar10 >> 0x10);
            if (iVar10 >> 0x10 < 1) {
              BVar13 = '\0';
            }
            pout[lVar6 * 4 + 2] = BVar13;
            iVar10 = ((uint)((ulong)((long)iVar12 * 0x84210843) >> 0x24) - (iVar12 >> 0x1f) & 0xff)
                     * inf->alpha + (uint)pout[lVar6 * 4 + 1] * -0x10000;
            BVar13 = (BYTE)((uint)iVar10 >> 0x10);
            if (iVar10 >> 0x10 < 1) {
              BVar13 = '\0';
            }
            pout[lVar6 * 4 + 1] = BVar13;
            iVar7 = ((uint)((ulong)((long)iVar7 * 0x84210843) >> 0x24) - (iVar7 >> 0x1f) & 0xff) *
                    inf->alpha + (uint)pout[lVar6 * 4] * -0x10000;
            BVar13 = (BYTE)((uint)iVar7 >> 0x10);
            if (iVar7 >> 0x10 < 1) {
              BVar13 = '\0';
            }
            pout[lVar6 * 4] = BVar13;
            pout[lVar6 * 4 + 3] = 0xff;
            pin = (BYTE *)((long)pin + (long)step);
            lVar6 = lVar6 + 1;
          } while (count != (int)lVar6);
        }
      }
      else if (0 < count) {
        lVar8 = 0;
        do {
          uVar3 = *(ushort *)pin;
          uVar15 = (ulong)((uVar3 >> 2 & 0xf8) * 0x8f + ((uint)uVar3 * 8 & 0xff) * 0x4d +
                           (uVar3 >> 7 & 0xf8) * 0x24 >> 8);
          bVar1 = *(byte *)((long)pFVar5 + uVar15 * 4 + lVar6 * 0x518 + -0xa700);
          bVar2 = *(byte *)((long)pFVar5 + uVar15 * 4 + lVar6 * 0x518 + -0xa6ff);
          iVar14 = (uint)*(byte *)((long)pFVar5 + uVar15 * 4 + lVar6 * 0x518 + -0xa6fe) * inf->alpha
                   + (uint)pout[lVar8 * 4 + 2] * -0x10000;
          BVar13 = (BYTE)((uint)iVar14 >> 0x10);
          if (iVar14 >> 0x10 < 1) {
            BVar13 = '\0';
          }
          pout[lVar8 * 4 + 2] = BVar13;
          iVar14 = (uint)bVar2 * inf->alpha + (uint)pout[lVar8 * 4 + 1] * -0x10000;
          BVar13 = (BYTE)((uint)iVar14 >> 0x10);
          if (iVar14 >> 0x10 < 1) {
            BVar13 = '\0';
          }
          pout[lVar8 * 4 + 1] = BVar13;
          iVar14 = (uint)bVar1 * inf->alpha + (uint)pout[lVar8 * 4] * -0x10000;
          BVar13 = (BYTE)((uint)iVar14 >> 0x10);
          if (iVar14 >> 0x10 < 1) {
            BVar13 = '\0';
          }
          pout[lVar8 * 4] = BVar13;
          pout[lVar8 * 4 + 3] = 0xff;
          pin = (BYTE *)((long)pin + (long)step);
          lVar8 = lVar8 + 1;
        } while (count != (int)lVar8);
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}